

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O2

void MPIX_step_send(comm_pkg *comm,void *send_data,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *send_requests,char **send_buffer_ptr)

{
  comm_data *pcVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  int j;
  ulong uVar5;
  long lVar6;
  int ctr;
  int local_68;
  int local_64;
  int type_size;
  int size;
  MPI_Request *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  void *local_38;
  
  local_68 = tag;
  local_58 = send_requests;
  local_38 = send_data;
  MPI_Type_size(mpi_type,&type_size);
  iVar4 = comm->send_data->size_msgs;
  uVar5 = 0;
  if (iVar4 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    MPI_Pack_size(iVar4,mpi_type,mpi_comm,&size);
    iVar4 = -1;
    if (-1 < size) {
      iVar4 = size;
    }
    pcVar3 = (char *)operator_new__((long)iVar4);
  }
  ctr = 0;
  local_50 = 0;
  while (pcVar1 = comm->send_data, local_50 < pcVar1->num_msgs) {
    local_64 = pcVar1->procs[local_50];
    iVar4 = pcVar1->indptr[local_50 + 1];
    lVar2 = local_50 + 1;
    local_48 = local_50;
    local_40 = uVar5;
    for (lVar6 = (long)pcVar1->indptr[local_50]; local_50 = lVar2, lVar6 < iVar4; lVar6 = lVar6 + 1)
    {
      MPI_Pack((void *)((long)type_size * (long)comm->send_data->indices[lVar6] + (long)local_38),1,
               mpi_type,pcVar3,size,&ctr,mpi_comm);
      lVar2 = local_50;
    }
    MPI_Isend(pcVar3 + (int)local_40,ctr - (int)local_40,&ompi_mpi_packed,local_64,local_68,mpi_comm
              ,local_58 + local_48);
    uVar5 = (ulong)(uint)ctr;
  }
  if (pcVar3 != (char *)0x0) {
    *send_buffer_ptr = pcVar3;
  }
  return;
}

Assistant:

static void MPIX_step_send(comm_pkg* comm, void* send_data,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* send_requests, char** send_buffer_ptr)
{
    int idx, proc, start, end;
    int size, type_size, addr;
    char* send_buffer = NULL;
    char* data = reinterpret_cast<char*>(send_data);
    MPI_Type_size(mpi_type, &type_size);
    if (comm->send_data->size_msgs)
    {
        MPI_Pack_size(comm->send_data->size_msgs, mpi_type, mpi_comm, &size);
        send_buffer = new char[size];
    }

    int ctr = 0;
    int prev_ctr = 0;
    for (int i = 0; i < comm->send_data->num_msgs; i++)
    {
        proc = comm->send_data->procs[i];
        start = comm->send_data->indptr[i];
        end = comm->send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = comm->send_data->indices[j];
            MPI_Pack(&(data[idx*type_size]), 1, mpi_type, 
                    send_buffer, size, &ctr, mpi_comm);
        }
        MPI_Isend(&send_buffer[prev_ctr], ctr - prev_ctr, MPI_PACKED, proc, tag,
                mpi_comm, &send_requests[i]);
        prev_ctr = ctr;
    }

    if (send_buffer) *send_buffer_ptr = send_buffer;
}